

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O1

int mg_session_read_failure_message(mg_session *session,mg_message_failure **message)

{
  int iVar1;
  mg_map *in_RAX;
  mg_message_failure *pmVar2;
  mg_map *metadata;
  mg_message_failure local_18;
  
  local_18.metadata = in_RAX;
  iVar1 = mg_session_read_map(session,&local_18.metadata);
  if (iVar1 == 0) {
    pmVar2 = (mg_message_failure *)mg_allocator_malloc(session->decoder_allocator,8);
    if (pmVar2 == (mg_message_failure *)0x0) {
      mg_session_set_error(session,"out of memory");
      mg_map_destroy(local_18.metadata);
      iVar1 = -3;
    }
    else {
      pmVar2->metadata = local_18.metadata;
      *message = pmVar2;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int mg_session_read_failure_message(mg_session *session,
                                    mg_message_failure **message) {
  mg_map *metadata;
  MG_RETURN_IF_FAILED(mg_session_read_map(session, &metadata));

  mg_message_failure *tmessage = mg_allocator_malloc(
      session->decoder_allocator, sizeof(mg_message_failure));
  if (!tmessage) {
    mg_session_set_error(session, "out of memory");
    mg_map_destroy(metadata);
    return MG_ERROR_OOM;
  }
  tmessage->metadata = metadata;
  *message = tmessage;
  return 0;
}